

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

void __thiscall ON_XMLNodePrivate::SetTagName(ON_XMLNodePrivate *this,wchar_t *name)

{
  ON_wString *this_00;
  
  std::recursive_mutex::lock(&this->m_mutex);
  this_00 = &this->m_name;
  ON_wString::operator=(this_00,name);
  ON_wString::TrimLeft(this_00,(wchar_t *)0x0);
  ON_wString::TrimRight(this_00,(wchar_t *)0x0);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void ON_XMLNodePrivate::SetTagName(const wchar_t* name)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  m_name = name;
  m_name.TrimLeft();
  m_name.TrimRight();
}